

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Vec_Int_t * Dtc_ManFindCommonCuts(Gia_Man_t *p,Vec_Int_t *vCutsXor,Vec_Int_t *vCutsMaj)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *vFadds;
  int i;
  int *pLimit1;
  int *pLimit0;
  int *pCuts1;
  int *pCuts0;
  Vec_Int_t *vCutsMaj_local;
  Vec_Int_t *vCutsXor_local;
  Gia_Man_t *p_local;
  
  pCuts1 = Vec_IntArray(vCutsXor);
  pLimit0 = Vec_IntArray(vCutsMaj);
  piVar2 = Vec_IntLimit(vCutsXor);
  piVar3 = Vec_IntLimit(vCutsMaj);
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Vec_IntSize(vCutsXor);
  if (iVar1 % 4 != 0) {
    __assert_fail("Vec_IntSize(vCutsXor) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0x178,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar1 = Vec_IntSize(vCutsMaj);
  if (iVar1 % 4 != 0) {
    __assert_fail("Vec_IntSize(vCutsMaj) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0x179,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  while (pCuts1 < piVar2 && pLimit0 < piVar3) {
    for (vFadds._4_4_ = 0; (vFadds._4_4_ < 3 && (pCuts1[vFadds._4_4_] == pLimit0[vFadds._4_4_]));
        vFadds._4_4_ = vFadds._4_4_ + 1) {
    }
    if (vFadds._4_4_ == 3) {
      for (vFadds._4_4_ = 0; vFadds._4_4_ < 4; vFadds._4_4_ = vFadds._4_4_ + 1) {
        Vec_IntPush(p_00,pCuts1[vFadds._4_4_]);
      }
      Vec_IntPush(p_00,pLimit0[3]);
      pCuts1 = pCuts1 + 4;
      pLimit0 = pLimit0 + 4;
    }
    else if (pCuts1[vFadds._4_4_] < pLimit0[vFadds._4_4_]) {
      pCuts1 = pCuts1 + 4;
    }
    else if (pLimit0[vFadds._4_4_] < pCuts1[vFadds._4_4_]) {
      pLimit0 = pLimit0 + 4;
    }
  }
  iVar1 = Vec_IntSize(p_00);
  if (iVar1 % 5 == 0) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                ,0x18c,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Dtc_ManFindCommonCuts( Gia_Man_t * p, Vec_Int_t * vCutsXor, Vec_Int_t * vCutsMaj )
{
    int * pCuts0 = Vec_IntArray(vCutsXor);
    int * pCuts1 = Vec_IntArray(vCutsMaj);
    int * pLimit0 = Vec_IntLimit(vCutsXor);
    int * pLimit1 = Vec_IntLimit(vCutsMaj);   int i;
    Vec_Int_t * vFadds = Vec_IntAlloc( 1000 );
    assert( Vec_IntSize(vCutsXor) % 4 == 0 );
    assert( Vec_IntSize(vCutsMaj) % 4 == 0 );
    while ( pCuts0 < pLimit0 && pCuts1 < pLimit1 )
    {
        for ( i = 0; i < 3; i++ )
            if ( pCuts0[i] != pCuts1[i] )
                break;
        if ( i == 3 )
        {
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vFadds, pCuts0[i] );
            Vec_IntPush( vFadds, pCuts1[3] );
            pCuts0 += 4;
            pCuts1 += 4;
        }
        else if ( pCuts0[i] < pCuts1[i] )
            pCuts0 += 4;
        else if ( pCuts0[i] > pCuts1[i] )
            pCuts1 += 4;
    }
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    return vFadds;
}